

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O2

void priv_sock_send_buf(int fd,char *buf,uint len)

{
  ssize_t sVar1;
  
  priv_sock_send_int(fd,len);
  sVar1 = writen(fd,buf,(ulong)len);
  if ((uint)sVar1 == len) {
    return;
  }
  fwrite("priv_sock_send_buf error\n",0x19,1,_stderr);
  exit(1);
}

Assistant:

void priv_sock_send_buf(int fd, const char *buf, unsigned int len) {
  // send the str len
  priv_sock_send_int(fd, len);
  // send the str
  int ret = writen(fd, buf, len);
  if (ret != (int) len) {
    fprintf(stderr, "priv_sock_send_buf error\n");
    exit(EXIT_FAILURE);
  }
}